

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_FindForeignInitializationErrors_Test::
TestBody(ReflectionOpsTest_FindForeignInitializationErrors_Test *this)

{
  Message *message_00;
  char *message_01;
  TestRequiredForeign message;
  AssertHelper AStack_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  undefined1 local_50 [72];
  
  proto2_unittest::TestRequiredForeign::TestRequiredForeign
            ((TestRequiredForeign *)local_50,(Arena *)0x0);
  local_50[0x10] = local_50[0x10] | 1;
  if ((TestRequired *)local_50._48_8_ == (TestRequired *)0x0) {
    if ((local_50._8_8_ & 1) != 0) {
      local_50._8_8_ = *(undefined8 *)(local_50._8_8_ & 0xfffffffffffffffe);
    }
    local_50._48_8_ =
         Arena::DefaultConstruct<proto2_unittest::TestRequired>((Arena *)local_50._8_8_);
  }
  RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_50 + 0x18),
             Arena::DefaultConstruct<proto2_unittest::TestRequired>);
  RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_50 + 0x18),
             Arena::DefaultConstruct<proto2_unittest::TestRequired>);
  internal::(anonymous_namespace)::FindInitializationErrors_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)local_50,message_00);
  testing::internal::CmpHelperEQ<char[189],std::__cxx11::string>
            (local_80,
             "\"optional_message.a,\" \"optional_message.b,\" \"optional_message.c,\" \"repeated_message[0].a,\" \"repeated_message[0].b,\" \"repeated_message[0].c,\" \"repeated_message[1].a,\" \"repeated_message[1].b,\" \"repeated_message[1].c\""
             ,"FindInitializationErrors(message)",
             (char (*) [189])
             "optional_message.a,optional_message.b,optional_message.c,repeated_message[0].a,repeated_message[0].b,repeated_message[0].c,repeated_message[1].a,repeated_message[1].b,repeated_message[1].c"
             ,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_01 = anon_var_dwarf_a22956 + 5;
    }
    else {
      message_01 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x1d6,message_01);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  proto2_unittest::TestRequiredForeign::~TestRequiredForeign((TestRequiredForeign *)local_50);
  return;
}

Assistant:

TEST(ReflectionOpsTest, FindForeignInitializationErrors) {
  unittest::TestRequiredForeign message;
  message.mutable_optional_message();
  message.add_repeated_message();
  message.add_repeated_message();
  EXPECT_EQ(
      "optional_message.a,"
      "optional_message.b,"
      "optional_message.c,"
      "repeated_message[0].a,"
      "repeated_message[0].b,"
      "repeated_message[0].c,"
      "repeated_message[1].a,"
      "repeated_message[1].b,"
      "repeated_message[1].c",
      FindInitializationErrors(message));
}